

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

PipelineResourceAttribsType * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,Uint32 ResIndex)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 ResIndex_local;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = ResIndex;
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[37]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < this->m_Desc.NumResources",(char (*) [37])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x2c3);
    std::__cxx11::string::~string((string *)local_38);
  }
  return this->m_pResourceAttribs + (uint)msg.field_2._12_4_;
}

Assistant:

const PipelineResourceAttribsType& GetResourceAttribs(Uint32 ResIndex) const
    {
        VERIFY_EXPR(ResIndex < this->m_Desc.NumResources);
        return m_pResourceAttribs[ResIndex];
    }